

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

void __thiscall
v_hashmap<substring,_unsigned_long>::put_after_get
          (v_hashmap<substring,_unsigned_long> *this,substring *key,uint64_t hash,unsigned_long *val
          )

{
  substring *psVar1;
  hash_elem *phVar2;
  size_t sVar3;
  char *pcVar4;
  hash_elem *phVar5;
  size_t sVar6;
  
  phVar5 = (this->dat)._begin;
  sVar6 = this->last_position;
  if ((phVar5[sVar6].occupied == false) &&
     (phVar2 = (this->dat).end_array, sVar3 = this->num_occupants, this->num_occupants = sVar3 + 1,
     (ulong)(((long)phVar2 - (long)phVar5 >> 3) * -0x3333333333333333) <= sVar3 * 4 + 4)) {
    double_size(this);
    get(this,key,hash);
    phVar5 = (this->dat)._begin;
    sVar6 = this->last_position;
  }
  phVar5[sVar6].occupied = true;
  pcVar4 = key->end;
  psVar1 = &(this->dat)._begin[this->last_position].key;
  psVar1->begin = key->begin;
  psVar1->end = pcVar4;
  (this->dat)._begin[this->last_position].val = *val;
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }